

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

void __thiscall
helics::EndpointInfo::checkInterfacesForIssues
          (EndpointInfo *this,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *issues)

{
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  bool bVar1;
  unsigned_long *puVar2;
  size_type sVar3;
  size_type sVar4;
  size_t sVar5;
  size_type sVar6;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<helics::GlobalHandle>,_bool> pVar7;
  EndpointInformation *trg;
  iterator __end4_1;
  iterator __begin4_1;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *__range4_1;
  EndpointInformation *src;
  iterator __end4;
  iterator __begin4;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *__range4;
  set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
  handles;
  size_type sum_connections;
  unsigned_long max_connections;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
  *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
  *in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  _Rb_tree_const_iterator<helics::GlobalHandle> in_stack_fffffffffffffb90;
  size_type local_400;
  char *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8 [36];
  undefined4 local_3c4;
  _Base_ptr local_3c0;
  undefined1 local_3b8;
  reference local_3b0;
  EndpointInformation *local_3a8;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  local_3a0;
  long local_398;
  _Base_ptr local_390;
  undefined1 local_388;
  reference local_380;
  EndpointInformation *local_378;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  local_370;
  long local_368;
  char *local_330;
  undefined8 local_328;
  undefined1 local_320 [36];
  undefined4 local_2fc;
  char *local_2f8;
  undefined8 local_2f0;
  undefined4 local_2c4;
  long local_2c0;
  size_type local_2b8;
  size_type local_2b0;
  unsigned_long local_2a8 [3];
  char *local_290;
  undefined8 local_288;
  undefined1 local_280 [36];
  undefined4 local_25c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  undefined1 local_248 [16];
  undefined8 local_238;
  unsigned_long_long in_stack_fffffffffffffdd0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffdd8;
  char *pcVar8;
  char *in_stack_fffffffffffffde0;
  char *pcVar9;
  size_t in_stack_fffffffffffffde8;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  undefined8 uStack_1d0;
  long local_1c8;
  char *local_1c0;
  undefined8 uStack_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a8 [16];
  undefined4 local_198 [4];
  unsigned_long local_188 [2];
  undefined8 local_178;
  undefined1 *local_170;
  char *local_168;
  undefined8 uStack_160;
  unsigned_long *local_158;
  undefined4 *local_150;
  long local_148;
  char *local_140;
  undefined8 uStack_138;
  undefined1 *local_130;
  undefined1 local_128 [16];
  int local_118 [4];
  size_type local_108 [2];
  undefined8 local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined8 uStack_e0;
  size_type *local_d0;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  char *local_b8;
  undefined8 uStack_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined8 *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  int local_7c;
  int *local_78;
  undefined4 local_6c;
  undefined4 *local_68;
  size_type local_60;
  size_type *local_58;
  unsigned_long local_50;
  unsigned_long *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  unsigned_long local_20;
  unsigned_long *local_18;
  size_type local_10;
  size_type *local_8;
  
  if ((*(byte *)(in_RDI + 0x162) & 1) != 0) {
    local_258 = in_RSI;
    if ((((*(byte *)(in_RDI + 0x161) & 1) != 0) &&
        (bVar1 = std::
                 vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
                 empty(in_stack_fffffffffffffb80), bVar1)) &&
       (bVar1 = std::
                vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
                empty(in_stack_fffffffffffffb80), bVar1)) {
      local_25c = 0xfffffffe;
      local_290 = "Endpoint {} is required but has no connections";
      local_288 = 0x2e;
      local_1c8 = in_RDI + 8;
      local_1b0 = local_280;
      local_1c0 = "Endpoint {} is required but has no connections";
      uStack_1b8 = 0x2e;
      local_1d8 = "Endpoint {} is required but has no connections";
      uStack_1d0 = 0x2e;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      local_98 = &local_1e8;
      local_1e8 = 0xd;
      fmt.size_ = in_stack_fffffffffffffde8;
      fmt.data_ = in_stack_fffffffffffffde0;
      args.field_1.values_ = in_stack_fffffffffffffdd8.values_;
      args.desc_ = in_stack_fffffffffffffdd0;
      local_a0 = local_1f8;
      local_1e0 = local_1f8;
      ::fmt::v11::vformat_abi_cxx11_(fmt,args);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffb80,(Errors *)in_stack_fffffffffffffb78,
                 in_stack_fffffffffffffb70);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb70);
    }
    if (0 < *(int *)(in_RDI + 0x168)) {
      local_2b0 = std::
                  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  ::size((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                          *)(in_RDI + 0xf0));
      local_2b8 = std::
                  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  ::size((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                          *)(in_RDI + 0xd8));
      puVar2 = CLI::std::max<unsigned_long>(&local_2b0,&local_2b8);
      local_2a8[0] = *puVar2;
      sVar3 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
              ::size((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                      *)(in_RDI + 0xf0));
      sVar4 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
              ::size((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                      *)(in_RDI + 0xd8));
      local_2c0 = sVar3 + sVar4;
      if ((ulong)(long)*(int *)(in_RDI + 0x168) < local_2a8[0]) {
        if (*(int *)(in_RDI + 0x168) == 1) {
          local_2c4 = 0xfffffffe;
          local_2f8 = "Endpoint {} is single source only but has more than one connection";
          local_2f0 = 0x42;
          sVar5 = in_RDI + 8;
          pcVar8 = "Endpoint {} is single source only but has more than one connection";
          pcVar9 = (char *)0x42;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                    );
          local_88 = &local_238;
          local_238 = 0xd;
          fmt_00.size_ = sVar5;
          fmt_00.data_ = pcVar9;
          args_00.field_1.values_ = (value<fmt::v11::context> *)pcVar8;
          args_00.desc_ = (unsigned_long_long)local_248;
          local_90 = local_248;
          ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffb80,(Errors *)in_stack_fffffffffffffb78,
                     in_stack_fffffffffffffb70);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb70);
        }
        else {
          local_2fc = 0xfffffffe;
          local_330 = "Endpoint {} requires {} connections but has at least {}";
          local_328 = 0x37;
          local_148 = in_RDI + 8;
          local_150 = (undefined4 *)(in_RDI + 0x168);
          local_130 = local_320;
          local_140 = "Endpoint {} requires {} connections but has at least {}";
          uStack_138 = 0x37;
          local_158 = local_2a8;
          local_168 = "Endpoint {} requires {} connections but has at least {}";
          uStack_160 = 0x37;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                    );
          local_68 = local_198;
          local_6c = *local_150;
          local_48 = local_188;
          local_50 = *local_158;
          local_28 = &local_178;
          local_178 = 0x41d;
          fmt_01.size_ = in_stack_fffffffffffffde8;
          fmt_01.data_ = in_stack_fffffffffffffde0;
          args_01.field_1.values_ = in_stack_fffffffffffffdd8.values_;
          args_01.desc_ = in_stack_fffffffffffffdd0;
          local_30 = local_1a8;
          local_20 = local_50;
          local_18 = local_48;
          local_198[0] = local_6c;
          local_188[0] = local_50;
          local_170 = local_1a8;
          ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffb80,(Errors *)in_stack_fffffffffffffb78,
                     in_stack_fffffffffffffb70);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb70);
        }
      }
      else if ((int)local_2c0 != *(int *)(in_RDI + 0x168)) {
        std::
        set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
        ::set((set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
               *)0x5bdee3);
        local_368 = in_RDI + 0xd8;
        local_370._M_current =
             (EndpointInformation *)
             std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ::begin(in_stack_fffffffffffffb68);
        local_378 = (EndpointInformation *)
                    std::
                    vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                    ::end(in_stack_fffffffffffffb68);
        while (bVar1 = __gnu_cxx::
                       operator==<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 ((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                   *)in_stack_fffffffffffffb70,
                                  (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                   *)in_stack_fffffffffffffb68), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_380 = __gnu_cxx::
                      __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                      ::operator*(&local_370);
          pVar7 = std::
                  set<helics::GlobalHandle,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
                  ::emplace<helics::GlobalHandle_const&>
                            ((set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
                              *)in_stack_fffffffffffffb90._M_node,
                             (GlobalHandle *)
                             CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
          local_390 = (_Base_ptr)pVar7.first._M_node;
          local_388 = pVar7.second;
          __gnu_cxx::
          __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
          ::operator++(&local_370);
        }
        local_398 = in_RDI + 0xf0;
        local_3a0._M_current =
             (EndpointInformation *)
             std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ::begin(in_stack_fffffffffffffb68);
        local_3a8 = (EndpointInformation *)
                    std::
                    vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                    ::end(in_stack_fffffffffffffb68);
        while (bVar1 = __gnu_cxx::
                       operator==<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 ((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                   *)in_stack_fffffffffffffb70,
                                  (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                   *)in_stack_fffffffffffffb68), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_3b0 = __gnu_cxx::
                      __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                      ::operator*(&local_3a0);
          pVar7 = std::
                  set<helics::GlobalHandle,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
                  ::emplace<helics::GlobalHandle_const&>
                            ((set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
                              *)in_stack_fffffffffffffb90._M_node,
                             (GlobalHandle *)
                             CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
          in_stack_fffffffffffffb90 = pVar7.first._M_node;
          in_stack_fffffffffffffb8f = pVar7.second;
          local_3c0 = in_stack_fffffffffffffb90._M_node;
          local_3b8 = in_stack_fffffffffffffb8f;
          __gnu_cxx::
          __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
          ::operator++(&local_3a0);
        }
        sVar6 = std::
                set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
                ::size((set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
                        *)0x5be07b);
        if ((int)sVar6 != *(int *)(in_RDI + 0x168)) {
          local_3c4 = 0xfffffffe;
          local_3f8 = "Endpoint {} requires {} connections but has only {}";
          local_3f0 = 0x33;
          x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
          this_00 = (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(in_RDI + 0x168);
          local_400 = std::
                      set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
                      ::size((set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
                              *)0x5be0ee);
          local_a8 = local_3e8;
          local_b8 = local_3f8;
          uStack_b0 = local_3f0;
          local_d0 = &local_400;
          local_e8 = local_3f8;
          uStack_e0 = local_3f0;
          local_c8 = this_00;
          local_c0 = x;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)this_00,x);
          local_78 = local_118;
          local_7c = ((anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)
                     &local_c8->
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )->int_value;
          local_58 = local_108;
          local_60 = *local_d0;
          local_38 = &local_f8;
          local_40 = local_128;
          local_f8 = 0x41d;
          fmt_02.size_ = in_stack_fffffffffffffde8;
          fmt_02.data_ = in_stack_fffffffffffffde0;
          args_02.field_1.values_ = in_stack_fffffffffffffdd8.values_;
          args_02.desc_ = in_stack_fffffffffffffdd0;
          local_10 = local_60;
          local_8 = local_58;
          local_118[0] = local_7c;
          local_108[0] = local_60;
          local_f0 = local_40;
          ::fmt::v11::vformat_abi_cxx11_(fmt_02,args_02);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>(this_00,(Errors *)x,local_258);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258)
          ;
        }
        std::
        set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
        ::~set((set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
                *)0x5be2d1);
      }
    }
  }
  return;
}

Assistant:

void EndpointInfo::checkInterfacesForIssues(std::vector<std::pair<int, std::string>>& issues)
{
    if (!targetedEndpoint) {
        return;
    }
    if (required) {
        if (sourceInformation.empty() && targetInformation.empty()) {
            issues.emplace_back(helics::defs::Errors::CONNECTION_FAILURE,
                                fmt::format("Endpoint {} is required but has no connections", key));
        }
    }
    if (requiredConnections > 0) {
        auto max_connections = (std::max)(targetInformation.size(), sourceInformation.size());
        auto sum_connections = targetInformation.size() + sourceInformation.size();

        if (max_connections > static_cast<size_t>(requiredConnections)) {
            if (requiredConnections == 1) {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format(
                        "Endpoint {} is single source only but has more than one connection", key));
            } else {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format("Endpoint {} requires {} connections but has at least {}",
                                key,
                                requiredConnections,
                                max_connections));
            }
        } else {
            if (static_cast<std::int32_t>(sum_connections) != requiredConnections) {
                std::set<GlobalHandle> handles;
                for (const auto& src : sourceInformation) {
                    handles.emplace(src.id);
                }
                for (const auto& trg : targetInformation) {
                    handles.emplace(trg.id);
                }
                if (static_cast<std::int32_t>(handles.size()) != requiredConnections) {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format("Endpoint {} requires {} connections but has only {}",
                                    key,
                                    requiredConnections,
                                    handles.size()));
                }
            }
        }
    }
}